

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

void __thiscall OpenMD::MoleculeStamp::checkInversions(MoleculeStamp *this)

{
  int iVar1;
  pointer ppBVar2;
  long lVar3;
  pointer piVar4;
  pointer ppAVar5;
  AtomStamp *this_00;
  bool bVar6;
  int __tmp;
  int iVar7;
  _Rb_tree_color _Var8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  pointer piVar11;
  pointer ppIVar12;
  iterator iVar13;
  InversionStamp *pIVar14;
  ostream *poVar15;
  OpenMDException *pOVar16;
  int iVar17;
  pointer ppIVar18;
  _Head_base<3UL,_int,_false> _Var19;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  long lVar20;
  size_t j;
  ulong uVar21;
  ulong uVar22;
  vector<int,_std::allocator<int>_> satellites;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allInversions;
  int b;
  undefined1 auStack_214 [12];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  tuple<int,_int,_int,_int> inversionTuple;
  vector<int,_std::allocator<int>_> inversion;
  _Bind<std::less<int>_(std::_Placeholder<1>,_int)> local_1c0;
  _Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> local_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  uVar22 = 0;
  do {
    ppIVar12 = (this->inversionStamps_).
               super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppIVar18 = (this->inversionStamps_).
               super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppIVar18 - (long)ppIVar12 >> 3) <= uVar22) {
      lVar20 = 0;
      for (uVar22 = 0; uVar22 < (ulong)((long)ppIVar18 - (long)ppIVar12 >> 3); uVar22 = uVar22 + 1)
      {
        lVar3 = *(long *)((long)ppIVar12 + (lVar20 >> 0x1d));
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&b,
                   (vector<int,_std::allocator<int>_> *)(lVar3 + 0xa0));
        allInversions._M_t._M_impl._0_4_ = *(undefined4 *)(lVar3 + 0x98);
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  ((vector<int,_std::allocator<int>_> *)&b,_b,(value_type_conflict1 *)&allInversions
                  );
        local_1b8._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>.
        super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
        _M_head_impl = (_Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>)
                       (((long)(this->atomStamps_).
                               super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->atomStamps_).
                               super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) - 1);
        _Var9 = std::
                find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                          (_b,_Stack_210,&local_1b8);
        local_1c0._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_int>.
        super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Tuple_impl<0UL,_std::_Placeholder<1>,_int>)(_Tuple_impl<1UL,_int>)0x0;
        _Var10 = std::
                 find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                           (_b,_Stack_210,&local_1c0);
        if ((_Var9._M_current != _Stack_210._M_current) ||
           (_Var10._M_current != _Stack_210._M_current)) {
          poVar15 = std::operator<<((ostream *)&oss,"Error in Molecule ");
          std::__cxx11::string::string((string *)&allInversions,(string *)&(this->Name).data_);
          poVar15 = std::operator<<(poVar15,(string *)&allInversions);
          poVar15 = std::operator<<(poVar15,": atoms of inversion");
          containerToString<std::vector<int,std::allocator<int>>>
                    ((string *)&satellites,(OpenMD *)&b,cont);
          poVar15 = std::operator<<(poVar15,(string *)&satellites);
          std::operator<<(poVar15," have invalid indices\n");
          std::__cxx11::string::~string((string *)&satellites);
          std::__cxx11::string::~string((string *)&allInversions);
          pOVar16 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar16,(string *)&allInversions);
          __cxa_throw(pOVar16,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        bVar6 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                          ((vector<int,_std::allocator<int>_> *)&b);
        if (bVar6) {
          poVar15 = std::operator<<((ostream *)&oss,"Error in Molecule ");
          std::__cxx11::string::string((string *)&allInversions,(string *)&(this->Name).data_);
          poVar15 = std::operator<<(poVar15,(string *)&allInversions);
          poVar15 = std::operator<<(poVar15," : atoms of inversion");
          containerToString<std::vector<int,std::allocator<int>>>
                    ((string *)&satellites,(OpenMD *)&b,cont_00);
          poVar15 = std::operator<<(poVar15,(string *)&satellites);
          std::operator<<(poVar15," have duplicated indices\n");
          std::__cxx11::string::~string((string *)&satellites);
          std::__cxx11::string::~string((string *)&allInversions);
          pOVar16 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar16,(string *)&allInversions);
          __cxa_throw(pOVar16,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&b);
        ppIVar12 = (this->inversionStamps_).
                   super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppIVar18 = (this->inversionStamps_).
                   super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        lVar20 = lVar20 + 0x100000000;
      }
      for (uVar22 = 0; uVar22 < (ulong)((long)ppIVar18 - (long)ppIVar12 >> 3); uVar22 = uVar22 + 1)
      {
        pIVar14 = ppIVar12[(int)uVar22];
        std::vector<int,_std::allocator<int>_>::vector(&satellites,&pIVar14->satellites_);
        allInversions._M_t._M_impl._0_4_ = pIVar14->center_;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&satellites,(int *)&allInversions)
        ;
        allInversions._M_t._M_impl._0_4_ = 0;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&b,
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,
                   (value_type_conflict1 *)&allInversions,(allocator_type *)&inversion);
        piVar4 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (piVar11 = satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar11 !=
            satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish; piVar11 = piVar11 + 1) {
          iVar1 = piVar4[*piVar11];
          lVar20 = (long)iVar1;
          if ((-1 < lVar20) &&
             (iVar7 = *(_b + lVar20 * 4), *(_b + lVar20 * 4) = iVar7 + 1, 2 < iVar7)) {
            poVar15 = std::operator<<((ostream *)&oss,"Error in Molecule ");
            std::__cxx11::string::string((string *)&allInversions,(string *)&(this->Name).data_);
            poVar15 = std::operator<<(poVar15,(string *)&allInversions);
            poVar15 = std::operator<<(poVar15,": inversion centered on atom ");
            poVar15 = (ostream *)std::ostream::operator<<(poVar15,pIVar14->center_);
            poVar15 = std::operator<<(poVar15," has four atoms that belong to same rigidbody ");
            poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar1);
            std::operator<<(poVar15,"\n");
            std::__cxx11::string::~string((string *)&allInversions);
            pOVar16 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar16,(string *)&allInversions);
            __cxa_throw(pOVar16,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&b);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&satellites.super__Vector_base<int,_std::allocator<int>_>);
        ppIVar12 = (this->inversionStamps_).
                   super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppIVar18 = (this->inversionStamps_).
                   super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      allInversions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &allInversions._M_t._M_impl.super__Rb_tree_header._M_header;
      allInversions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      allInversions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      allInversions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar20 = 0;
      uVar22 = 0;
      allInversions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           allInversions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        if ((ulong)((long)ppIVar18 - (long)ppIVar12 >> 3) <= uVar22) {
          uVar22 = 0;
          do {
            ppAVar5 = (this->atomStamps_).
                      super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->atomStamps_).
                              super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar5 >> 3) <=
                uVar22) {
              std::
              _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
              ::~_Rb_tree(&allInversions._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
              return;
            }
            this_00 = ppAVar5[(int)uVar22];
            if ((long)(this_00->bonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this_00->bonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start == 0xc) {
              _b = (undefined1  [16])0x0;
              local_208._M_allocated_capacity = 0;
              inversion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)(this_00->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_left;
              _Var8 = ~_S_red;
              if ((_Rb_tree_header *)
                  inversion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &(this_00->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header) {
                _Var8 = ((_Base_ptr)
                        ((long)inversion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x20))->_M_color;
              }
              while( true ) {
                satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = _Var8;
                if (_Var8 == ~_S_red) break;
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)&b,
                           (value_type_conflict1 *)&satellites);
                _Var8 = AtomStamp::getNextBondedAtom(this_00,(AtomIter *)&inversion);
              }
              if ((long)_Stack_210._M_current - (long)_b != 0xc) {
                poVar15 = std::operator<<((ostream *)&oss,"Error in Molecule ");
                std::__cxx11::string::string((string *)&satellites,(string *)&(this->Name).data_);
                poVar15 = std::operator<<(poVar15,(string *)&satellites);
                poVar15 = std::operator<<(poVar15,": found bond mismatch");
                std::operator<<(poVar15," when detecting inversion centers.");
                std::__cxx11::string::~string((string *)&satellites);
                pOVar16 = (OpenMDException *)__cxa_allocate_exception(0x28);
                std::__cxx11::stringbuf::str();
                OpenMDException::OpenMDException(pOVar16,(string *)&satellites);
                __cxa_throw(pOVar16,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
              }
              iVar1 = this_00->index_;
              std::
              __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ();
              satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = (int)*(undefined8 *)((long)_b + 4);
              satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ =
                   (int)((ulong)*(undefined8 *)((long)_b + 4) >> 0x20);
              satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = *_b;
              satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ = iVar1;
              iVar13 = std::
                       _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                       ::find(&allInversions._M_t,(key_type *)&satellites);
              if ((_Rb_tree_header *)iVar13._M_node ==
                  &allInversions._M_t._M_impl.super__Rb_tree_header) {
                std::
                _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                          ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                            *)&allInversions,(tuple<int,_int,_int,_int> *)&satellites);
                pIVar14 = (InversionStamp *)operator_new(0xf8);
                InversionStamp::InversionStamp(pIVar14);
                pIVar14->center_ = iVar1;
                InversionStamp::setSatellites(pIVar14,(vector<int,_std::allocator<int>_> *)&b);
                addInversionStamp(this,pIVar14);
              }
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&b);
            }
            uVar22 = uVar22 + 1;
          } while( true );
        }
        lVar3 = *(long *)((long)ppIVar12 + (lVar20 >> 0x1d));
        iVar1 = *(int *)(lVar3 + 0x98);
        std::vector<int,_std::allocator<int>_>::vector
                  (&inversion,(vector<int,_std::allocator<int>_> *)(lVar3 + 0xa0));
        _Var19._M_head_impl =
             inversion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[2];
        iVar7 = inversion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[1];
        inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
        super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
             *inversion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
        iVar17 = iVar7;
        if (_Var19._M_head_impl < iVar7) {
          iVar17 = _Var19._M_head_impl;
          _Var19._M_head_impl = iVar7;
        }
        inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
        super__Head_base<2UL,_int,_false>._M_head_impl = iVar17;
        if (iVar17 < inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                     super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                     _M_head_impl) {
          inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
          super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
          super__Head_base<2UL,_int,_false>._M_head_impl =
               inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
               super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
          inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
          super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
               iVar17;
        }
        inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
        super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
        super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
             (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)_Var19._M_head_impl;
        if (_Var19._M_head_impl <
            inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Head_base<2UL,_int,_false>._M_head_impl) {
          inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
          super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
          super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
               (_Head_base<3UL,_int,_false>)
               (_Head_base<3UL,_int,_false>)
               inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
               super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
               super__Head_base<2UL,_int,_false>._M_head_impl;
          inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
          super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
          super__Head_base<2UL,_int,_false>._M_head_impl = _Var19._M_head_impl;
        }
        inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
        _M_head_impl = iVar1;
        iVar13 = std::
                 _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                 ::find((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                         *)&allInversions,&inversionTuple);
        if ((_Rb_tree_header *)iVar13._M_node != &allInversions._M_t._M_impl.super__Rb_tree_header)
        break;
        std::
        _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
        ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                  ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                    *)&allInversions,&inversionTuple);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&inversion.super__Vector_base<int,_std::allocator<int>_>);
        uVar22 = uVar22 + 1;
        ppIVar12 = (this->inversionStamps_).
                   super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppIVar18 = (this->inversionStamps_).
                   super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        lVar20 = lVar20 + 0x100000000;
      }
      poVar15 = std::operator<<((ostream *)&oss,"Error in Molecule ");
      std::__cxx11::string::string((string *)&satellites,(string *)&(this->Name).data_);
      poVar15 = std::operator<<(poVar15,(string *)&satellites);
      poVar15 = std::operator<<(poVar15,": ");
      poVar15 = std::operator<<(poVar15,"Inversion");
      containerToString<std::vector<int,std::allocator<int>>>
                ((string *)&b,(OpenMD *)&inversion,cont_01);
      poVar15 = std::operator<<(poVar15,(string *)&b);
      std::operator<<(poVar15," appears multiple times\n");
      std::__cxx11::string::~string((string *)&b);
      std::__cxx11::string::~string((string *)&satellites);
      pOVar16 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      OpenMDException::OpenMDException(pOVar16,(string *)&satellites);
      __cxa_throw(pOVar16,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    pIVar14 = ppIVar12[(int)uVar22];
    iVar1 = pIVar14->center_;
    satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((long)(pIVar14->satellites_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pIVar14->satellites_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != 0xc) {
      lVar20 = 0;
      for (uVar21 = 0;
          ppBVar2 = (this->bondStamps_).
                    super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          uVar21 < (ulong)((long)(this->bondStamps_).
                                 super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar2 >> 3);
          uVar21 = uVar21 + 1) {
        lVar3 = *(long *)((long)ppBVar2 + (lVar20 >> 0x1d));
        allInversions._M_t._M_impl._0_4_ = *(int *)(lVar3 + 0xa0);
        iVar7 = *(int *)(lVar3 + 0xa4);
        b = iVar7;
        if (allInversions._M_t._M_impl._0_4_ == iVar1) {
          std::vector<int,_std::allocator<int>_>::push_back(&satellites,&b);
          iVar7 = b;
        }
        if (iVar7 == iVar1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&satellites,(value_type_conflict1 *)&allInversions);
        }
        lVar20 = lVar20 + 0x100000000;
      }
      if ((long)satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0xc) {
        poVar15 = std::operator<<((ostream *)&oss,"Error in Molecule ");
        std::__cxx11::string::string((string *)&allInversions,(string *)&(this->Name).data_);
        poVar15 = std::operator<<(poVar15,(string *)&allInversions);
        poVar15 = std::operator<<(poVar15,": found wrong number");
        poVar15 = std::operator<<(poVar15," of bonds for inversion center ");
        std::ostream::operator<<(poVar15,iVar1);
        std::__cxx11::string::~string((string *)&allInversions);
        pOVar16 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar16,(string *)&allInversions);
        __cxa_throw(pOVar16,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      InversionStamp::setSatellites(pIVar14,&satellites);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&satellites.super__Vector_base<int,_std::allocator<int>_>);
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

void MoleculeStamp::checkInversions() {
    std::ostringstream oss;

    // first we automatically find the other three atoms that
    // are satellites of an inversion center:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int center                     = inversionStamp->getCenter();
      std::vector<int> satellites;

      // Some inversions come pre-programmed with the satellites.  If
      // so, don't add the satellites as they are already there.

      if (inversionStamp->getNSatellites() != 3) {
        for (std::size_t j = 0; j < getNBonds(); ++j) {
          BondStamp* bondStamp = getBondStamp(j);
          int a                = bondStamp->getA();
          int b                = bondStamp->getB();

          if (a == center) { satellites.push_back(b); }
          if (b == center) { satellites.push_back(a); }
        }

        if (satellites.size() == 3) {
          std::sort(satellites.begin(), satellites.end());
          inversionStamp->setSatellites(satellites);
        } else {
          oss << "Error in Molecule " << getName() << ": found wrong number"
              << " of bonds for inversion center " << center;
          throw OpenMDException(oss.str());
        }
      }
    }

    // then we do some sanity checking on the inversions:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);

      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      // add the central atom to the beginning of the list:
      inversionAtoms.insert(inversionAtoms.begin(),
                            inversionStamp->getCenter());

      std::vector<int>::iterator j =
          std::find_if(inversionAtoms.begin(), inversionAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(inversionAtoms.begin(), inversionAtoms.end(),
                       std::bind(std::less<int>(), std::placeholders::_1, 0));

      if (j != inversionAtoms.end() || k != inversionAtoms.end()) {
        oss << "Error in Molecule " << getName() << ": atoms of inversion"
            << containerToString(inversionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(inversionAtoms)) {
        oss << "Error in Molecule " << getName() << " : atoms of inversion"
            << containerToString(inversionAtoms)
            << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp  = getInversionStamp(i);
      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      inversionAtoms.push_back(inversionStamp->getCenter());
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = inversionAtoms.begin(); j != inversionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Molecule " << getName()
                << ": inversion centered on atom "
                << inversionStamp->getCenter()
                << " has four atoms that belong to same rigidbody "
                << rigidbodyIndex << "\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allInversions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int cent                       = inversionStamp->getCenter();
      std::vector<int> inversion     = inversionStamp->getSatellites();

      std::tuple<int, int, int, int> inversionTuple {
          cent, inversion[0], inversion[1], inversion[2]};
      auto& [first, second, third, fourth] = inversionTuple;

      // In OpenMD, the Central atom in an inversion comes first, and
      // has a special position.  The other three atoms can come in
      // random order, and should be sorted in increasing numerical
      // order to check for duplicates.  This requires three pairwise
      // swaps:
      if (third > fourth) std::swap(third, fourth);
      if (second > third) std::swap(second, third);
      if (third > fourth) std::swap(third, fourth);

      iter = allInversions.find(inversionTuple);
      if (iter == allInversions.end()) {
        allInversions.insert(inversionTuple);
      } else {
        oss << "Error in Molecule " << getName() << ": "
            << "Inversion" << containerToString(inversion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }

    // Next we automatically find the inversion centers that weren't
    // explicitly created.  An inversion center is any atom that has
    // exactly three bonds to it.  Not all inversion centers have
    // potentials associated with them.

    for (std::size_t i = 0; i < getNAtoms(); ++i) {
      AtomStamp* ai = getAtomStamp(i);
      if (ai->getCoordination() == 3) {
        AtomStamp::AtomIter ai2;
        std::vector<int> satellites;
        for (int a = ai->getFirstBondedAtom(ai2); a != -1;
             a     = ai->getNextBondedAtom(ai2)) {
          satellites.push_back(a);
        }
        if (satellites.size() == 3) {
          int cent = ai->getIndex();
          std::sort(satellites.begin(), satellites.end());

          std::tuple<int, int, int, int> newInversion {
              cent, satellites[0], satellites[1], satellites[2]};
          auto [first, second, third, fourth] = newInversion;

          if (third > fourth) std::swap(third, fourth);
          if (second > third) std::swap(second, third);
          if (third > fourth) std::swap(third, fourth);

          if (allInversions.find(newInversion) == allInversions.end()) {
            allInversions.insert(newInversion);
            InversionStamp* newInversionStamp = new InversionStamp();
            newInversionStamp->setCenter(cent);
            newInversionStamp->setSatellites(satellites);
            addInversionStamp(newInversionStamp);
          }

        } else {
          oss << "Error in Molecule " << getName() << ": found bond mismatch"
              << " when detecting inversion centers.";
          throw OpenMDException(oss.str());
        }
      }
    }
  }